

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationshipRecord.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::RelationshipRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RelationshipRecord *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Relationship Record:");
  poVar1 = std::operator<<(poVar1,"\n\tNature:   ");
  ENUMS::GetEnumAsStringRelationshipNature_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16Nature,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tPosition: ");
  ENUMS::GetEnumAsStringRelationshipPosition_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui16Pos,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RelationshipRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Relationship Record:"
       << "\n\tNature:   " << GetEnumAsStringRelationshipNature( m_ui16Nature )
       << "\n\tPosition: " << GetEnumAsStringRelationshipPosition( m_ui16Pos )
       << "\n";

    return ss.str();
}